

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_array_refcount.cpp
# Opt level: O1

void __thiscall
ir_array_refcount_entry::ir_array_refcount_entry(ir_array_refcount_entry *this,ir_variable *var)

{
  uint uVar1;
  uint *__s;
  glsl_type *pgVar2;
  ulong __n;
  
  this->var = var;
  this->is_referenced = false;
  uVar1 = glsl_type::arrays_of_arrays_size(var->type);
  if (uVar1 == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = glsl_type::arrays_of_arrays_size(var->type);
  }
  this->num_bits = uVar1;
  __n = (ulong)((uint)((ulong)uVar1 + 0x1f >> 3) & 0xfffffffc);
  __s = (uint *)operator_new__(__n);
  this->bits = __s;
  memset(__s,0,__n);
  this->array_depth = 0;
  pgVar2 = var->type;
  if (pgVar2->field_0x4 == '\x11') {
    uVar1 = 1;
    do {
      this->array_depth = uVar1;
      pgVar2 = (pgVar2->fields).array;
      uVar1 = uVar1 + 1;
    } while (pgVar2->field_0x4 == '\x11');
  }
  return;
}

Assistant:

ir_array_refcount_entry::ir_array_refcount_entry(ir_variable *var)
   : var(var), is_referenced(false)
{
   num_bits = MAX2(1, var->type->arrays_of_arrays_size());
   bits = new BITSET_WORD[BITSET_WORDS(num_bits)];
   memset(bits, 0, BITSET_WORDS(num_bits) * sizeof(bits[0]));

   /* Count the "depth" of the arrays-of-arrays. */
   array_depth = 0;
   for (const glsl_type *type = var->type;
        type->is_array();
        type = type->fields.array) {
      array_depth++;
   }
}